

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serverbrowser_filter.cpp
# Opt level: O2

bool __thiscall SortWrap::operator()(SortWrap *this,int a,int b)

{
  undefined1 uVar1;
  undefined4 in_register_00000014;
  long *plVar2;
  code *UNRECOVERED_JUMPTABLE_00;
  
  UNRECOVERED_JUMPTABLE_00 = (code *)this->m_pfnSort;
  plVar2 = (long *)((long)((this->m_pThis->m_FilterInfo).m_aGametype + -2) + 8 +
                   *(long *)&this->field_0x8);
  if (this->m_pThis->m_pServerBrowserFilter->m_pConfig->m_BrSortOrder != 0) {
    if (((ulong)UNRECOVERED_JUMPTABLE_00 & 1) != 0) {
      this = (SortWrap *)*plVar2;
      UNRECOVERED_JUMPTABLE_00 =
           *(code **)((undefined1 *)((long)&this[-1].m_pThis + 7) + (long)UNRECOVERED_JUMPTABLE_00);
    }
    uVar1 = (*UNRECOVERED_JUMPTABLE_00)(plVar2,b,a,this,UNRECOVERED_JUMPTABLE_00);
    return (bool)uVar1;
  }
  if (((ulong)UNRECOVERED_JUMPTABLE_00 & 1) != 0) {
    this = (SortWrap *)*plVar2;
    UNRECOVERED_JUMPTABLE_00 =
         *(code **)((undefined1 *)((long)&this[-1].m_pThis + 7) + (long)UNRECOVERED_JUMPTABLE_00);
  }
  uVar1 = (*UNRECOVERED_JUMPTABLE_00)
                    (plVar2,a,CONCAT44(in_register_00000014,b),this,UNRECOVERED_JUMPTABLE_00);
  return (bool)uVar1;
}

Assistant:

bool operator()(int a, int b) { return (m_pThis->Config()->m_BrSortOrder ? (m_pThis->*m_pfnSort)(b, a) : (m_pThis->*m_pfnSort)(a, b)); }